

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O3

void __thiscall
helics::PublicationInfo::removeSubscriber(PublicationInfo *this,GlobalHandle subscriberToRemove)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  long lVar4;
  GlobalFederateId GVar5;
  InterfaceHandle IVar6;
  long lVar7;
  long lVar8;
  pointer pSVar9;
  iterator iVar10;
  
  pSVar2 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pSVar1 - (long)pSVar2;
  lVar8 = (lVar4 >> 3) * -0x3333333333333333 >> 2;
  GVar5 = subscriberToRemove.fed_id.gid;
  IVar6 = subscriberToRemove.handle.hid;
  pSVar3 = pSVar2;
  lVar7 = lVar4;
  iVar10._M_current = pSVar1;
  if (0 < lVar8) {
    pSVar3 = pSVar2 + lVar8 * 4;
    lVar8 = lVar8 + 1;
    pSVar9 = pSVar2 + 2;
    do {
      if ((pSVar9[-2].id.fed_id.gid == GVar5.gid) && (pSVar9[-2].id.handle.hid == IVar6.hid)) {
        pSVar9 = pSVar9 + -2;
        goto LAB_002cd0f5;
      }
      if ((pSVar9[-1].id.fed_id.gid == GVar5.gid) && (pSVar9[-1].id.handle.hid == IVar6.hid)) {
        pSVar9 = pSVar9 + -1;
        goto LAB_002cd0f5;
      }
      if (((pSVar9->id).fed_id.gid == GVar5.gid) && ((pSVar9->id).handle.hid == IVar6.hid))
      goto LAB_002cd0f5;
      if ((pSVar9[1].id.fed_id.gid == GVar5.gid) && (pSVar9[1].id.handle.hid == IVar6.hid)) {
        pSVar9 = pSVar9 + 1;
        goto LAB_002cd0f5;
      }
      lVar8 = lVar8 + -1;
      pSVar9 = pSVar9 + 4;
    } while (1 < lVar8);
    lVar7 = (long)pSVar1 - (long)pSVar3;
  }
  lVar7 = (lVar7 >> 3) * -0x3333333333333333;
  if (lVar7 == 1) {
LAB_002cd0df:
    pSVar9 = pSVar3;
    if (IVar6.hid != (pSVar3->id).handle.hid || GVar5.gid != (pSVar3->id).fed_id.gid) {
      pSVar9 = pSVar1;
    }
  }
  else if (lVar7 == 3) {
    if (((pSVar3->id).fed_id.gid != GVar5.gid) ||
       (pSVar9 = pSVar3, (pSVar3->id).handle.hid != IVar6.hid)) {
      pSVar3 = pSVar3 + 1;
      goto LAB_002cd0c3;
    }
  }
  else {
    if (lVar7 != 2) goto LAB_002cd156;
LAB_002cd0c3:
    if (((pSVar3->id).fed_id.gid != GVar5.gid) ||
       (pSVar9 = pSVar3, (pSVar3->id).handle.hid != IVar6.hid)) {
      pSVar3 = pSVar3 + 1;
      goto LAB_002cd0df;
    }
  }
LAB_002cd0f5:
  if ((pSVar9 != pSVar1) && (pSVar3 = pSVar9 + 1, iVar10._M_current = pSVar9, pSVar3 != pSVar1)) {
    do {
      if (((pSVar3->id).fed_id.gid != GVar5.gid) || ((pSVar3->id).handle.hid != IVar6.hid)) {
        pSVar9->id = pSVar3->id;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar9->key,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar3->key)
        ;
        pSVar9 = pSVar9 + 1;
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
    pSVar2 = (this->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->subscribers).
                  super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
    iVar10._M_current = pSVar9;
  }
LAB_002cd156:
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
  _M_erase(&this->subscribers,iVar10,
           (SubscriberInformation *)((long)&(pSVar2->id).fed_id.gid + lVar4));
  return;
}

Assistant:

void PublicationInfo::removeSubscriber(GlobalHandle subscriberToRemove)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [subscriberToRemove](const auto& val) {
                                         return val.id == subscriberToRemove;
                                     }),
                      subscribers.end());
}